

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O1

int afm_stream_skip_spaces(AFM_Stream stream)

{
  int in_EAX;
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  if (0 < stream->status) {
    return in_EAX;
  }
  pbVar3 = stream->cursor;
  do {
    while( true ) {
      uVar1 = 0xffffffff;
      pbVar4 = pbVar3;
      if (pbVar3 < stream->limit) {
        pbVar4 = pbVar3 + 1;
        stream->cursor = pbVar4;
        uVar1 = (uint)*pbVar3;
      }
      pbVar3 = pbVar4;
      if (0xc < (int)uVar1) break;
      if (uVar1 != 9) {
        if (uVar1 == 0xffffffff) {
LAB_0023460f:
          iVar2 = 3;
        }
        else {
          if (uVar1 != 10) {
            return uVar1;
          }
LAB_00234616:
          iVar2 = 2;
        }
LAB_00234627:
        stream->status = iVar2;
        return iVar2;
      }
    }
    if ((int)uVar1 < 0x20) {
      if (uVar1 == 0xd) goto LAB_00234616;
      if (uVar1 != 0x1a) {
        return uVar1;
      }
      goto LAB_0023460f;
    }
    if (uVar1 != 0x20) {
      if (uVar1 != 0x3b) {
        return uVar1;
      }
      iVar2 = 1;
      goto LAB_00234627;
    }
  } while( true );
}

Assistant:

static int
  afm_stream_skip_spaces( AFM_Stream  stream )
  {
    int  ch = 0;  /* make stupid compiler happy */


    if ( AFM_STATUS_EOC( stream ) )
      return ';';

    while ( 1 )
    {
      ch = AFM_GETC();
      if ( !AFM_IS_SPACE( ch ) )
        break;
    }

    if ( AFM_IS_NEWLINE( ch ) )
      stream->status = AFM_STREAM_STATUS_EOL;
    else if ( AFM_IS_SEP( ch ) )
      stream->status = AFM_STREAM_STATUS_EOC;
    else if ( AFM_IS_EOF( ch ) )
      stream->status = AFM_STREAM_STATUS_EOF;

    return ch;
  }